

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O0

void __thiscall duckdb::LogicalGet::Serialize(LogicalGet *this,Serializer *serializer)

{
  pointer ptr_p;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> *in_RSI;
  Serializer *in_RDI;
  Serializer *in_stack_ffffffffffffffc8;
  LogicalOperator *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  field_id_t fVar1;
  optional_ptr<duckdb::FunctionData,_true> in_stack_ffffffffffffffe8;
  optional_ptr<duckdb::FunctionData,_true> bind_info;
  
  fVar1 = (field_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  LogicalOperator::Serialize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Serializer::WriteProperty<unsigned_long>
            (in_RDI,fVar1,(char *)in_stack_ffffffffffffffd0,
             (unsigned_long *)in_stack_ffffffffffffffc8);
  Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
            (in_RDI,fVar1,(char *)in_stack_ffffffffffffffd0,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffc8);
  Serializer::WriteProperty<duckdb::vector<std::__cxx11::string,true>>
            (in_RDI,fVar1,(char *)in_stack_ffffffffffffffd0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_stack_ffffffffffffffc8);
  Serializer::WriteProperty<duckdb::vector<unsigned_long,true>>
            (in_RDI,fVar1,(char *)in_stack_ffffffffffffffd0,
             (vector<unsigned_long,_true> *)in_stack_ffffffffffffffc8);
  Serializer::WriteProperty<duckdb::TableFilterSet>
            (in_RDI,fVar1,(char *)in_stack_ffffffffffffffd0,
             (TableFilterSet *)in_stack_ffffffffffffffc8);
  fVar1 = (field_id_t)
          ((ulong)&(in_RDI->data).contexts.c.
                   super__Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish >> 0x30);
  bind_info.ptr = (FunctionData *)in_RSI;
  ptr_p = ::std::unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>::get
                    (in_RSI);
  optional_ptr<duckdb::FunctionData,_true>::optional_ptr
            ((optional_ptr<duckdb::FunctionData,_true> *)&stack0xffffffffffffffe8,ptr_p);
  FunctionSerializer::Serialize<duckdb::TableFunction>
            ((Serializer *)in_stack_ffffffffffffffe8.ptr,(TableFunction *)in_RDI,bind_info);
  if (*(_Map_pointer *)
       ((long)&(in_RDI->data).types.c.
               super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
               ._M_impl.super__Deque_impl_data._M_start + 0x18) == (_Map_pointer)0x0) {
    Serializer::WriteProperty<duckdb::vector<duckdb::Value,true>>
              (in_RDI,fVar1,(char *)in_RSI,(vector<duckdb::Value,_true> *)in_stack_ffffffffffffffc8)
    ;
    Serializer::
    WriteProperty<std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
              (in_RDI,fVar1,(char *)in_RSI,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)in_stack_ffffffffffffffc8);
    Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
              (in_RDI,fVar1,(char *)in_RSI,
               (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffc8);
    Serializer::WriteProperty<duckdb::vector<std::__cxx11::string,true>>
              (in_RDI,fVar1,(char *)in_RSI,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)in_stack_ffffffffffffffc8);
  }
  Serializer::WriteProperty<duckdb::vector<unsigned_long,true>>
            (in_RDI,fVar1,(char *)in_RSI,(vector<unsigned_long,_true> *)in_stack_ffffffffffffffc8);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::ColumnIndex,true>>
            (in_RDI,fVar1,(char *)in_RSI,
             (vector<duckdb::ColumnIndex,_true> *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void LogicalGet::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WriteProperty(200, "table_index", table_index);
	serializer.WriteProperty(201, "returned_types", returned_types);
	serializer.WriteProperty(202, "names", names);
	/* [Deleted] (vector<column_t>) "column_ids" */
	serializer.WriteProperty(204, "projection_ids", projection_ids);
	serializer.WriteProperty(205, "table_filters", table_filters);
	FunctionSerializer::Serialize(serializer, function, bind_data.get());
	if (!function.serialize) {
		D_ASSERT(!function.serialize);
		// no serialize method: serialize input values and named_parameters for rebinding purposes
		serializer.WriteProperty(206, "parameters", parameters);
		serializer.WriteProperty(207, "named_parameters", named_parameters);
		serializer.WriteProperty(208, "input_table_types", input_table_types);
		serializer.WriteProperty(209, "input_table_names", input_table_names);
	}
	serializer.WriteProperty(210, "projected_input", projected_input);
	serializer.WritePropertyWithDefault(211, "column_indexes", column_ids);
}